

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::csharp::GetFileNamespace_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FileDescriptor *descriptor)

{
  bool in_R9B;
  string_view input;
  
  if ((*(byte *)(*(long *)(this + 0x80) + 0x28) & 0x10) == 0) {
    input._M_str = (char *)0x1;
    input._M_len = **(size_t **)(this + 0x10);
    UnderscoresToCamelCase_abi_cxx11_
              (__return_storage_ptr__,(csharp *)(*(size_t **)(this + 0x10))[1],input,true,in_R9B);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)(*(ulong *)(*(long *)(this + 0x80) + 0x68) & 0xfffffffffffffffc));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetFileNamespace(const FileDescriptor* descriptor) {
  if (descriptor->options().has_csharp_namespace()) {
    return descriptor->options().csharp_namespace();
  }
  return UnderscoresToCamelCase(descriptor->package(), true, true);
}